

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ImplicitTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitTypeSyntax,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1,Token *args_2)

{
  size_t sVar1;
  pointer ppVVar2;
  Info *pIVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  ImplicitTypeSyntax *pIVar15;
  long lVar16;
  
  pIVar15 = (ImplicitTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitTypeSyntax *)this->endPtr < pIVar15 + 1) {
    pIVar15 = (ImplicitTypeSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pIVar15 + 1);
  }
  TVar6 = args->kind;
  uVar7 = args->field_0x2;
  NVar8.raw = (args->numFlags).raw;
  uVar9 = args->rawLen;
  pIVar3 = args->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar4 = args_2->info;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = ImplicitType;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0
  ;
  (pIVar15->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (pIVar15->signing).kind = TVar6;
  (pIVar15->signing).field_0x2 = uVar7;
  (pIVar15->signing).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar15->signing).rawLen = uVar9;
  (pIVar15->signing).info = pIVar3;
  uVar10 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar10;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pIVar15->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f7698;
  (pIVar15->dimensions).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar1 = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pIVar15->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args_1->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
            _M_ptr;
  (pIVar15->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar1;
  (pIVar15->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f78c0;
  (pIVar15->placeholder).kind = TVar11;
  (pIVar15->placeholder).field_0x2 = uVar12;
  (pIVar15->placeholder).numFlags = (NumericTokenFlags)NVar13.raw;
  (pIVar15->placeholder).rawLen = uVar14;
  (pIVar15->placeholder).info = pIVar4;
  (pIVar15->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pIVar15;
  sVar1 = (pIVar15->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppVVar2 = (pIVar15->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(ImplicitTypeSyntax **)(*(long *)((long)ppVVar2 + lVar16) + 8) = pIVar15;
      lVar16 = lVar16 + 8;
    } while (sVar1 << 3 != lVar16);
  }
  return pIVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }